

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_enc.c
# Opt level: O0

int rsa_encrypt(void *vprsactx,uchar *out,size_t *outlen,size_t outsize,uchar *in,size_t inlen)

{
  int iVar1;
  int iVar2;
  OSSL_LIB_CTX *ctx;
  EVP_MD *pEVar3;
  long *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  uchar *in_R8;
  int in_R9D;
  uchar *unaff_retaddr;
  int in_stack_0000000c;
  uchar *in_stack_00000010;
  uchar *tbuf;
  uchar *in_stack_00000020;
  int rsasize;
  size_t len;
  int ret;
  PROV_RSA_CTX *prsactx;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  int local_44;
  int local_4;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (in_RSI == (uchar *)0x0) {
    iVar1 = RSA_size(*(RSA **)(in_RDI + 8));
    iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if ((long)iVar1 == 0) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff90);
      ERR_set_error(0x39,0x9e,(char *)0x0);
      local_4 = 0;
    }
    else {
      *in_RDX = (long)iVar1;
      local_4 = 1;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x10) == 4) {
      iVar1 = RSA_size(*(RSA **)(in_RDI + 8));
      ctx = (OSSL_LIB_CTX *)
            CRYPTO_malloc(iVar1,"providers/implementations/asymciphers/rsa_enc.c",0x9f);
      if (ctx == (OSSL_LIB_CTX *)0x0) {
        ERR_new();
        ERR_set_debug((char *)ctx,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                      in_stack_ffffffffffffff90);
        ERR_set_error(0x39,0xc0100,(char *)0x0);
        return 0;
      }
      if (*(long *)(in_RDI + 0x18) == 0) {
        CRYPTO_free(ctx);
        pEVar3 = EVP_MD_fetch(ctx,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        iVar1 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        *(EVP_MD **)(in_RDI + 0x18) = pEVar3;
        ERR_new();
        ERR_set_debug((char *)ctx,iVar1,in_stack_ffffffffffffff90);
        ERR_set_error(0x39,0xc0103,(char *)0x0);
        return 0;
      }
      iVar2 = ossl_rsa_padding_add_PKCS1_OAEP_mgf1_ex
                        ((OSSL_LIB_CTX *)len,in_stack_00000020,tbuf._4_4_,in_stack_00000010,
                         in_stack_0000000c,unaff_retaddr,(int)inlen,(EVP_MD *)in,(EVP_MD *)outsize);
      if (iVar2 == 0) {
        CRYPTO_free(ctx);
        return 0;
      }
      local_44 = RSA_public_encrypt(iVar1,(uchar *)ctx,in_RSI,*(RSA **)(in_RDI + 8),3);
      CRYPTO_free(ctx);
    }
    else {
      local_44 = RSA_public_encrypt(in_R9D,in_R8,in_RSI,*(RSA **)(in_RDI + 8),
                                    *(int *)(in_RDI + 0x10));
    }
    if (local_44 < 0) {
      local_4 = local_44;
    }
    else {
      *in_RDX = (long)local_44;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int rsa_encrypt(void *vprsactx, unsigned char *out, size_t *outlen,
                       size_t outsize, const unsigned char *in, size_t inlen)
{
    PROV_RSA_CTX *prsactx = (PROV_RSA_CTX *)vprsactx;
    int ret;

    if (!ossl_prov_is_running())
        return 0;

    if (out == NULL) {
        size_t len = RSA_size(prsactx->rsa);

        if (len == 0) {
            ERR_raise(ERR_LIB_PROV, PROV_R_INVALID_KEY);
            return 0;
        }
        *outlen = len;
        return 1;
    }

    if (prsactx->pad_mode == RSA_PKCS1_OAEP_PADDING) {
        int rsasize = RSA_size(prsactx->rsa);
        unsigned char *tbuf;

        if ((tbuf = OPENSSL_malloc(rsasize)) == NULL) {
            ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
            return 0;
        }
        if (prsactx->oaep_md == NULL) {
            OPENSSL_free(tbuf);
            prsactx->oaep_md = EVP_MD_fetch(prsactx->libctx, "SHA-1", NULL);
            ERR_raise(ERR_LIB_PROV, ERR_R_INTERNAL_ERROR);
            return 0;
        }
        ret =
            ossl_rsa_padding_add_PKCS1_OAEP_mgf1_ex(prsactx->libctx, tbuf,
                                                    rsasize, in, inlen,
                                                    prsactx->oaep_label,
                                                    prsactx->oaep_labellen,
                                                    prsactx->oaep_md,
                                                    prsactx->mgf1_md);

        if (!ret) {
            OPENSSL_free(tbuf);
            return 0;
        }
        ret = RSA_public_encrypt(rsasize, tbuf, out, prsactx->rsa,
                                 RSA_NO_PADDING);
        OPENSSL_free(tbuf);
    } else {
        ret = RSA_public_encrypt(inlen, in, out, prsactx->rsa,
                                 prsactx->pad_mode);
    }
    /* A ret value of 0 is not an error */
    if (ret < 0)
        return ret;
    *outlen = ret;
    return 1;
}